

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump2XYZCmd.cpp
# Opt level: O0

int cmdline_parser_dump(FILE *outfile,gengetopt_args_info *args_info)

{
  char *in_RSI;
  FILE *in_RDI;
  int i;
  char **in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  int local_4;
  
  uVar1 = 0;
  if (in_RDI == (FILE *)0x0) {
    fprintf(_stderr,"%s: cannot dump options to stream\n","Dump2XYZ");
    local_4 = 1;
  }
  else {
    if (*(int *)(in_RSI + 0x1a8) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)(ulong)in_stack_ffffffffffffffe0,
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1ac) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1b0) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1b4) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1b8) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1bc) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1c0) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1c4) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1c8) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1cc) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1d0) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1d4) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1d8) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1dc) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1e0) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1e4) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1e8) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1ec) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1f0) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 500) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1f8) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x1fc) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x200) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
cmdline_parser_dump(FILE *outfile, struct gengetopt_args_info *args_info)
{
  int i = 0;

  if (!outfile)
    {
      fprintf (stderr, "%s: cannot dump options to stream\n", CMDLINE_PARSER_PACKAGE);
      return EXIT_FAILURE;
    }

  if (args_info->help_given)
    write_into_file(outfile, "help", 0, 0 );
  if (args_info->version_given)
    write_into_file(outfile, "version", 0, 0 );
  if (args_info->input_given)
    write_into_file(outfile, "input", args_info->input_orig, 0);
  if (args_info->output_given)
    write_into_file(outfile, "output", args_info->output_orig, 0);
  if (args_info->frame_given)
    write_into_file(outfile, "frame", args_info->frame_orig, 0);
  if (args_info->water_given)
    write_into_file(outfile, "water", 0, 0 );
  if (args_info->periodicBox_given)
    write_into_file(outfile, "periodicBox", 0, 0 );
  if (args_info->zconstraint_given)
    write_into_file(outfile, "zconstraint", 0, 0 );
  if (args_info->rigidbody_given)
    write_into_file(outfile, "rigidbody", 0, 0 );
  if (args_info->watertype_given)
    write_into_file(outfile, "watertype", 0, 0 );
  if (args_info->selection_given)
    write_into_file(outfile, "selection", args_info->selection_orig, 0);
  if (args_info->originsele_given)
    write_into_file(outfile, "originsele", args_info->originsele_orig, 0);
  if (args_info->refsele_given)
    write_into_file(outfile, "refsele", args_info->refsele_orig, 0);
  if (args_info->repeatX_given)
    write_into_file(outfile, "repeatX", args_info->repeatX_orig, 0);
  if (args_info->repeatY_given)
    write_into_file(outfile, "repeatY", args_info->repeatY_orig, 0);
  if (args_info->repeatZ_given)
    write_into_file(outfile, "repeatZ", args_info->repeatZ_orig, 0);
  if (args_info->basetype_given)
    write_into_file(outfile, "basetype", 0, 0 );
  if (args_info->velocities_given)
    write_into_file(outfile, "velocities", 0, 0 );
  if (args_info->forces_given)
    write_into_file(outfile, "forces", 0, 0 );
  if (args_info->vectors_given)
    write_into_file(outfile, "vectors", 0, 0 );
  if (args_info->charges_given)
    write_into_file(outfile, "charges", 0, 0 );
  if (args_info->efield_given)
    write_into_file(outfile, "efield", 0, 0 );
  if (args_info->globalID_given)
    write_into_file(outfile, "globalID", 0, 0 );
  

  i = EXIT_SUCCESS;
  return i;
}